

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O0

void __thiscall
Potassco::SmodelsConvert::acycEdge(SmodelsConvert *this,int s,int t,LitSpan *condition)

{
  Atom_t AVar1;
  undefined8 in_RCX;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  StringBuilder buf;
  undefined4 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffffa7;
  undefined8 in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffcf;
  undefined8 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffdc;
  undefined8 in_stack_ffffffffffffffe0;
  
  if ((*(byte *)(in_RDI + 0x18) & 1) == 0) {
    (**(code **)(**(long **)(in_RDI + 8) + 0x60))(*(long **)(in_RDI + 8),in_ESI,in_EDX,in_RCX);
  }
  StringBuilder::StringBuilder((StringBuilder *)0x11d52c);
  StringBuilder::appendFormat
            ((StringBuilder *)&stack0xffffffffffffffa8,"_edge(%d,%d)",(ulong)in_ESI,(ulong)in_EDX);
  AVar1 = makeAtom((SmodelsConvert *)in_stack_ffffffffffffffb0,(LitSpan *)in_stack_ffffffffffffffa8,
                   (bool)in_stack_ffffffffffffffa7);
  toSpan((StringBuilder *)0x11d57f);
  SmData::addOutput((SmData *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
                    (StringSpan *)in_stack_ffffffffffffffd0,(bool)in_stack_ffffffffffffffcf);
  StringBuilder::~StringBuilder((StringBuilder *)CONCAT44(AVar1,in_stack_ffffffffffffff70));
  return;
}

Assistant:

void SmodelsConvert::acycEdge(int s, int t, const LitSpan& condition) {
	if (!ext_) { out_.acycEdge(s, t, condition); }
	StringBuilder buf;
	buf.appendFormat("_edge(%d,%d)", s, t);
	data_->addOutput(makeAtom(condition, true), toSpan(buf), false);
}